

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

char * __thiscall google::protobuf::FastUInt32ToBufferLeft(protobuf *this,uint32 u,char *buffer)

{
  char *pcVar1;
  long lVar2;
  undefined4 in_register_00000034;
  char *ASCII_digits;
  char *pcStack_18;
  int digits;
  char *buffer_local;
  uint32 u_local;
  
  buffer_local._4_4_ = (uint)this;
  pcVar1 = (char *)CONCAT44(in_register_00000034,u);
  if (buffer_local._4_4_ < 1000000000) {
    pcStack_18 = pcVar1;
    if (99 < buffer_local._4_4_) {
      if (9999 < buffer_local._4_4_) {
        if (999999 < buffer_local._4_4_) {
          if (99999999 < buffer_local._4_4_) {
            pcStack_18 = pcVar1 + 1;
            *pcVar1 = (char)(buffer_local._4_4_ / 100000000) + '0';
            goto LAB_0036207a;
          }
          if (9999999 < buffer_local._4_4_) goto LAB_00362089;
          ASCII_digits._4_4_ = buffer_local._4_4_ / 1000000;
          pcStack_18 = pcVar1 + 1;
          *pcVar1 = (char)ASCII_digits._4_4_ + '0';
          goto LAB_003620d3;
        }
        if (99999 < buffer_local._4_4_) goto LAB_003620e2;
        ASCII_digits._4_4_ = buffer_local._4_4_ / 10000;
        pcStack_18 = pcVar1 + 1;
        *pcVar1 = (char)ASCII_digits._4_4_ + '0';
        goto LAB_0036212c;
      }
      if (999 < buffer_local._4_4_) goto LAB_0036213b;
      ASCII_digits._4_4_ = buffer_local._4_4_ / 100;
      pcStack_18 = pcVar1 + 1;
      *pcVar1 = (char)ASCII_digits._4_4_ + '0';
      goto LAB_00362185;
    }
    if (buffer_local._4_4_ < 10) {
      pcStack_18 = pcVar1 + 1;
      *pcVar1 = (char)this + '0';
      goto LAB_003621d2;
    }
  }
  else {
    lVar2 = (long)(int)(buffer_local._4_4_ / 100000000) * 2;
    *pcVar1 = two_ASCII_digits[lVar2];
    pcVar1[1] = two_ASCII_digits[lVar2 + 1];
    pcStack_18 = pcVar1 + 2;
LAB_0036207a:
    buffer_local._4_4_ = buffer_local._4_4_ % 100000000;
LAB_00362089:
    ASCII_digits._4_4_ = buffer_local._4_4_ / 1000000;
    *pcStack_18 = two_ASCII_digits[(long)(int)ASCII_digits._4_4_ * 2];
    pcStack_18[1] = two_ASCII_digits[(long)(int)ASCII_digits._4_4_ * 2 + 1];
    pcStack_18 = pcStack_18 + 2;
LAB_003620d3:
    buffer_local._4_4_ = buffer_local._4_4_ + ASCII_digits._4_4_ * -1000000;
LAB_003620e2:
    ASCII_digits._4_4_ = buffer_local._4_4_ / 10000;
    *pcStack_18 = two_ASCII_digits[(long)(int)ASCII_digits._4_4_ * 2];
    pcStack_18[1] = two_ASCII_digits[(long)(int)ASCII_digits._4_4_ * 2 + 1];
    pcStack_18 = pcStack_18 + 2;
LAB_0036212c:
    buffer_local._4_4_ = buffer_local._4_4_ + ASCII_digits._4_4_ * -10000;
LAB_0036213b:
    ASCII_digits._4_4_ = buffer_local._4_4_ / 100;
    *pcStack_18 = two_ASCII_digits[(long)(int)ASCII_digits._4_4_ * 2];
    pcStack_18[1] = two_ASCII_digits[(long)(int)ASCII_digits._4_4_ * 2 + 1];
    pcStack_18 = pcStack_18 + 2;
LAB_00362185:
    buffer_local._4_4_ = buffer_local._4_4_ + ASCII_digits._4_4_ * -100;
  }
  *pcStack_18 = two_ASCII_digits[(long)(int)buffer_local._4_4_ * 2];
  pcStack_18[1] = two_ASCII_digits[(long)(int)buffer_local._4_4_ * 2 + 1];
  pcStack_18 = pcStack_18 + 2;
LAB_003621d2:
  *pcStack_18 = '\0';
  return pcStack_18;
}

Assistant:

char* FastUInt32ToBufferLeft(uint32 u, char* buffer) {
  int digits;
  const char *ASCII_digits = NULL;
  // The idea of this implementation is to trim the number of divides to as few
  // as possible by using multiplication and subtraction rather than mod (%),
  // and by outputting two digits at a time rather than one.
  // The huge-number case is first, in the hopes that the compiler will output
  // that case in one branch-free block of code, and only output conditional
  // branches into it from below.
  if (u >= 1000000000) {  // >= 1,000,000,000
    digits = u / 100000000;  // 100,000,000
    ASCII_digits = two_ASCII_digits[digits];
    buffer[0] = ASCII_digits[0];
    buffer[1] = ASCII_digits[1];
    buffer += 2;
sublt100_000_000:
    u -= digits * 100000000;  // 100,000,000
lt100_000_000:
    digits = u / 1000000;  // 1,000,000
    ASCII_digits = two_ASCII_digits[digits];
    buffer[0] = ASCII_digits[0];
    buffer[1] = ASCII_digits[1];
    buffer += 2;
sublt1_000_000:
    u -= digits * 1000000;  // 1,000,000
lt1_000_000:
    digits = u / 10000;  // 10,000
    ASCII_digits = two_ASCII_digits[digits];
    buffer[0] = ASCII_digits[0];
    buffer[1] = ASCII_digits[1];
    buffer += 2;
sublt10_000:
    u -= digits * 10000;  // 10,000
lt10_000:
    digits = u / 100;
    ASCII_digits = two_ASCII_digits[digits];
    buffer[0] = ASCII_digits[0];
    buffer[1] = ASCII_digits[1];
    buffer += 2;
sublt100:
    u -= digits * 100;
lt100:
    digits = u;
    ASCII_digits = two_ASCII_digits[digits];
    buffer[0] = ASCII_digits[0];
    buffer[1] = ASCII_digits[1];
    buffer += 2;
done:
    *buffer = 0;
    return buffer;
  }

  if (u < 100) {
    digits = u;
    if (u >= 10) goto lt100;
    *buffer++ = '0' + digits;
    goto done;
  }
  if (u  <  10000) {   // 10,000
    if (u >= 1000) goto lt10_000;
    digits = u / 100;
    *buffer++ = '0' + digits;
    goto sublt100;
  }
  if (u  <  1000000) {   // 1,000,000
    if (u >= 100000) goto lt1_000_000;
    digits = u / 10000;  //    10,000
    *buffer++ = '0' + digits;
    goto sublt10_000;
  }
  if (u  <  100000000) {   // 100,000,000
    if (u >= 10000000) goto lt100_000_000;
    digits = u / 1000000;  //   1,000,000
    *buffer++ = '0' + digits;
    goto sublt1_000_000;
  }
  // we already know that u < 1,000,000,000
  digits = u / 100000000;   // 100,000,000
  *buffer++ = '0' + digits;
  goto sublt100_000_000;
}